

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.cpp
# Opt level: O2

bool is_limiter(char c)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 0;
  do {
    lVar2 = lVar1;
    if (lVar2 == 0x12) break;
    lVar1 = lVar2 + 1;
  } while ((&ninx::lexer::LIMITER_CHARS)[lVar2] != c);
  return lVar2 != 0x12;
}

Assistant:

bool is_limiter(char c) {
    bool found = false;
    for (char i : ninx::lexer::LIMITER_CHARS) {
        if (i == c) {
            found = true;
            break;
        }
    }
    return found;
}